

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O1

wchar_t archive_read_format_zip_streamable_read_header(archive_read *a,archive_entry *entry)

{
  char cVar1;
  zip *zip;
  bool bVar2;
  long lVar3;
  long in_RAX;
  zip_entry *pzVar4;
  void *pvVar5;
  wchar_t unaff_EBP;
  int64_t request;
  int64_t request_00;
  ssize_t bytes;
  long local_38;
  
  (a->archive).archive_format = 0x50000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "ZIP";
  }
  zip = (zip *)a->format->data;
  if (zip->has_encrypted_entries == -1) {
    zip->has_encrypted_entries = 0;
  }
  local_38 = in_RAX;
  if (zip->zip_entries == (zip_entry *)0x0) {
    pzVar4 = (zip_entry *)malloc(0x90);
    zip->zip_entries = pzVar4;
    if (pzVar4 == (zip_entry *)0x0) {
      archive_set_error(&a->archive,0xc,"Out  of memory");
      return L'\xffffffe2';
    }
  }
  zip->entry = zip->zip_entries;
  memset(zip->zip_entries,0,0x90);
  if (zip->cctx_valid != '\0') {
    aes_ctr_release(&zip->cctx);
  }
  if (zip->hctx_valid != '\0') {
    __hmac_sha1_cleanup(&zip->hctx);
  }
  zip->hctx_valid = '\0';
  zip->cctx_valid = '\0';
  zip->tctx_valid = '\0';
  __archive_read_reset_passphrase(a);
  __archive_read_consume(a,zip->unconsumed);
  zip->unconsumed = 0;
  do {
    pvVar5 = __archive_read_ahead(a,4,&local_38);
    if (pvVar5 == (void *)0x0) {
      unaff_EBP = L'\xffffffe2';
LAB_003d40db:
      bVar2 = false;
    }
    else {
      if (local_38 < 4) {
        request_00 = 0;
      }
      else {
        request = 0;
        do {
          if ((*(char *)((long)pvVar5 + request) == 'P') &&
             (*(char *)((long)pvVar5 + request + 1) == 'K')) {
            cVar1 = *(char *)((long)pvVar5 + request + 2);
            switch(cVar1) {
            case '\x01':
switchD_003d410e_caseD_1:
              if (*(char *)((long)pvVar5 + request + 3) == '\x02') goto LAB_003d4172;
              if (cVar1 == '\x06') goto switchD_003d410e_caseD_6;
              if (cVar1 == '\x05') goto switchD_003d410e_caseD_5;
              break;
            case '\x03':
              if (*(char *)((long)pvVar5 + request + 3) == '\x04') {
                __archive_read_consume(a,request);
                unaff_EBP = zip_read_local_file_header(a,entry,zip);
                goto LAB_003d40db;
              }
              if (cVar1 == '\x06') goto switchD_003d410e_caseD_6;
              if (cVar1 == '\x05') goto switchD_003d410e_caseD_5;
              if (cVar1 == '\x01') goto switchD_003d410e_caseD_1;
              break;
            case '\x05':
switchD_003d410e_caseD_5:
              if (*(char *)((long)pvVar5 + request + 3) == '\x06') goto LAB_003d4172;
              if (cVar1 == '\x06') goto switchD_003d410e_caseD_6;
              break;
            case '\x06':
switchD_003d410e_caseD_6:
              if (*(char *)((long)pvVar5 + request + 3) == '\x06') {
LAB_003d4172:
                unaff_EBP = L'\x01';
                goto LAB_003d40db;
              }
            }
          }
          request_00 = request + 1;
          lVar3 = request + 5;
          request = request_00;
        } while ((ulong)((long)pvVar5 + lVar3) <= (ulong)(local_38 + (long)pvVar5));
      }
      __archive_read_consume(a,request_00);
      bVar2 = true;
    }
    if (!bVar2) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

static int
archive_read_format_zip_streamable_read_header(struct archive_read *a,
    struct archive_entry *entry)
{
	struct zip *zip;

	a->archive.archive_format = ARCHIVE_FORMAT_ZIP;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "ZIP";

	zip = (struct zip *)(a->format->data);

	/*
	 * It should be sufficient to call archive_read_next_header() for
	 * a reader to determine if an entry is encrypted or not. If the
	 * encryption of an entry is only detectable when calling
	 * archive_read_data(), so be it. We'll do the same check there
	 * as well.
	 */
	if (zip->has_encrypted_entries ==
			ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW)
		zip->has_encrypted_entries = 0;

	/* Make sure we have a zip_entry structure to use. */
	if (zip->zip_entries == NULL) {
		zip->zip_entries = malloc(sizeof(struct zip_entry));
		if (zip->zip_entries == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Out  of memory");
			return ARCHIVE_FATAL;
		}
	}
	zip->entry = zip->zip_entries;
	memset(zip->entry, 0, sizeof(struct zip_entry));

	if (zip->cctx_valid)
		archive_decrypto_aes_ctr_release(&zip->cctx);
	if (zip->hctx_valid)
		archive_hmac_sha1_cleanup(&zip->hctx);
	zip->tctx_valid = zip->cctx_valid = zip->hctx_valid = 0;
	__archive_read_reset_passphrase(a);

	/* Search ahead for the next local file header. */
	__archive_read_consume(a, zip->unconsumed);
	zip->unconsumed = 0;
	for (;;) {
		int64_t skipped = 0;
		const char *p, *end;
		ssize_t bytes;

		p = __archive_read_ahead(a, 4, &bytes);
		if (p == NULL)
			return (ARCHIVE_FATAL);
		end = p + bytes;

		while (p + 4 <= end) {
			if (p[0] == 'P' && p[1] == 'K') {
				if (p[2] == '\003' && p[3] == '\004') {
					/* Regular file entry. */
					__archive_read_consume(a, skipped);
					return zip_read_local_file_header(a,
					    entry, zip);
				}

                              /*
                               * TODO: We cannot restore permissions
                               * based only on the local file headers.
                               * Consider scanning the central
                               * directory and returning additional
                               * entries for at least directories.
                               * This would allow us to properly set
                               * directory permissions.
			       *
			       * This won't help us fix symlinks
			       * and may not help with regular file
			       * permissions, either.  <sigh>
                               */
                              if (p[2] == '\001' && p[3] == '\002') {
                                      return (ARCHIVE_EOF);
                              }

                              /* End of central directory?  Must be an
                               * empty archive. */
                              if ((p[2] == '\005' && p[3] == '\006')
                                  || (p[2] == '\006' && p[3] == '\006'))
                                      return (ARCHIVE_EOF);
			}
			++p;
			++skipped;
		}
		__archive_read_consume(a, skipped);
	}
}